

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void stop_follower(CHAR_DATA *ch)

{
  byte *pbVar1;
  bool bVar2;
  string_view fmt;
  
  if (ch->master != (CHAR_DATA *)0x0) {
    bVar2 = is_affected_by(ch,0x12);
    if (bVar2) {
      pbVar1 = (byte *)((long)ch->affected_by + 2);
      *pbVar1 = *pbVar1 & 0xfb;
      switchD_00333f01::default(ch,(int)gsn_charm_person);
    }
    bVar2 = can_see(ch->master,ch);
    if ((bVar2) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) {
      bVar2 = is_npc(ch);
      if ((!bVar2) || (ch->pIndexData->vnum != 0xb8e)) {
        act("$n stops following you.",ch,(void *)0x0,ch->master,2);
        act("You stop following $N.",ch,(void *)0x0,ch->master,3);
        bVar2 = is_affected(ch,(int)gsn_trail);
        if (bVar2) {
          switchD_00333f01::default(ch,(int)gsn_trail);
        }
      }
    }
    if (ch->master->pet == ch) {
      ch->master->pet = (CHAR_DATA *)0x0;
    }
    check_leadership_affect(ch);
    ch->master = (CHAR_DATA *)0x0;
    ch->leader = (CHAR_DATA *)0x0;
    return;
  }
  fmt._M_str = "Stop_follower: nullptr master.";
  fmt._M_len = 0x1e;
  CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
  return;
}

Assistant:

void stop_follower(CHAR_DATA *ch)
{
	if (ch->master == nullptr)
	{
		RS.Logger.Debug("Stop_follower: nullptr master.");
		return;
	}

	if (is_affected_by(ch, AFF_CHARM))
	{
		REMOVE_BIT(ch->affected_by, AFF_CHARM);
		affect_strip(ch, gsn_charm_person);
	}

	if (can_see(ch->master, ch) && ch->in_room != nullptr && !(is_npc(ch) && ch->pIndexData->vnum == MOB_VNUM_ANCHOR))
	{
		act("$n stops following you.", ch, nullptr, ch->master, TO_VICT);
		act("You stop following $N.", ch, nullptr, ch->master, TO_CHAR);

		if (is_affected(ch, gsn_trail))
			affect_strip(ch, gsn_trail);
	}
	if (ch->master->pet == ch)
		ch->master->pet = nullptr;

	check_leadership_affect(ch);
	ch->master = nullptr;
	ch->leader = nullptr;
}